

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Parsing XVar1;
  bool bVar2;
  int iVar3;
  XML_Error unaff_EBP;
  char *next;
  char *local_38;
  
  parser->m_processor = epilogProcessor;
  parser->m_eventPtr = s;
  do {
    local_38 = (char *)0x0;
    iVar3 = (*parser->m_encoding->scanners[0])(parser->m_encoding,s,end,&local_38);
    parser->m_eventEndPtr = local_38;
    bVar2 = false;
    if (10 < iVar3) {
      if (iVar3 == 0xb) {
        iVar3 = reportProcessingInstruction(parser,parser->m_encoding,s,local_38);
LAB_004db167:
        if (iVar3 == 0) {
          unaff_EBP = XML_ERROR_NO_MEMORY;
          goto LAB_004db1aa;
        }
      }
      else {
        if (iVar3 == 0xd) {
          iVar3 = reportComment(parser,parser->m_encoding,s,local_38);
          goto LAB_004db167;
        }
        if (iVar3 != 0xf) goto switchD_004db080_caseD_fffffffd;
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,parser->m_encoding,s,local_38);
        }
      }
      parser->m_eventPtr = local_38;
      XVar1 = (parser->m_parsingStatus).parsing;
      s = local_38;
      if (XVar1 == XML_FINISHED) {
LAB_004db194:
        unaff_EBP = XML_ERROR_ABORTED;
        goto LAB_004db1aa;
      }
      if (XVar1 == XML_SUSPENDED) goto switchD_004db080_caseD_fffffffc;
      bVar2 = true;
      goto LAB_004db1ac;
    }
    switch(iVar3) {
    case 0:
      parser->m_eventPtr = local_38;
      unaff_EBP = XML_ERROR_INVALID_TOKEN;
      break;
    case -4:
switchD_004db080_caseD_fffffffc:
      *nextPtr = s;
      goto LAB_004db190;
    case -3:
switchD_004db080_caseD_fffffffd:
      unaff_EBP = XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
      local_38 = s;
      goto LAB_004db1ac;
    case -2:
      if ((parser->m_parsingStatus).finalBuffer == '\0') {
LAB_004db19b:
        unaff_EBP = XML_ERROR_NONE;
        *nextPtr = s;
      }
      else {
        unaff_EBP = XML_ERROR_PARTIAL_CHAR;
      }
      break;
    case -1:
      if ((parser->m_parsingStatus).finalBuffer == '\0') goto LAB_004db19b;
      unaff_EBP = XML_ERROR_UNCLOSED_TOKEN;
      break;
    default:
      if (iVar3 != -0xf) goto switchD_004db080_caseD_fffffffd;
      if ((parser->m_defaultHandler != (XML_DefaultHandler)0x0) &&
         (reportDefault(parser,parser->m_encoding,s,local_38),
         (parser->m_parsingStatus).parsing == XML_FINISHED)) goto LAB_004db194;
      *nextPtr = local_38;
LAB_004db190:
      unaff_EBP = XML_ERROR_NONE;
    }
LAB_004db1aa:
    bVar2 = false;
    local_38 = s;
LAB_004db1ac:
    s = local_38;
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static enum XML_Error PTRCALL
epilogProcessor(XML_Parser parser,
                const char *s,
                const char *end,
                const char **nextPtr)
{
  processor = epilogProcessor;
  eventPtr = s;
  for (;;) {
    const char *next = NULL;
    int tok = XmlPrologTok(encoding, s, end, &next);
    eventEndPtr = next;
    switch (tok) {
    /* report partial linebreak - it might be the last token */
    case -XML_TOK_PROLOG_S:
      if (defaultHandler) {
        reportDefault(parser, encoding, s, next);
        if (ps_parsing == XML_FINISHED)
          return XML_ERROR_ABORTED;
      }
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      *nextPtr = s;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (defaultHandler)
        reportDefault(parser, encoding, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (!ps_finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (!ps_finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    eventPtr = s = next;
    switch (ps_parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
}